

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O2

void __thiscall
cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::AddDependency
          (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *this,ClusterIndex parent,
          ClusterIndex child)

{
  long lVar1;
  pointer pEVar2;
  uint uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar2 = (this->entries).
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pEVar2[child].ancestors.m_val >> (parent & 0x1f) & 1) == 0) {
    for (uVar4 = pEVar2[parent].ancestors.m_val; uVar4 != 0; uVar4 = uVar4 - 1 & uVar4) {
      uVar3 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      pEVar2[uVar3].descendants.m_val =
           pEVar2[uVar3].descendants.m_val | pEVar2[child].descendants.m_val;
    }
    for (uVar4 = pEVar2[child].descendants.m_val; uVar4 != 0; uVar4 = uVar4 - 1 & uVar4) {
      uVar3 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      pEVar2[uVar3].ancestors.m_val = pEVar2[uVar3].ancestors.m_val | pEVar2[parent].ancestors.m_val
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddDependency(ClusterIndex parent, ClusterIndex child) noexcept
    {
        // Bail out if dependency is already implied.
        if (entries[child].ancestors[parent]) return;
        // To each ancestor of the parent, add as descendants the descendants of the child.
        const auto& chl_des = entries[child].descendants;
        for (auto anc_of_par : Ancestors(parent)) {
            entries[anc_of_par].descendants |= chl_des;
        }
        // To each descendant of the child, add as ancestors the ancestors of the parent.
        const auto& par_anc = entries[parent].ancestors;
        for (auto dec_of_chl : Descendants(child)) {
            entries[dec_of_chl].ancestors |= par_anc;
        }
    }